

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::DepthShader::DepthShader(DepthShader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderProgramDeclaration *pSVar2;
  UniformSlot *pUVar3;
  long *local_258;
  long local_250;
  long local_248 [2];
  VertexSource local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  FragmentOutput local_1b4;
  Uniform local_1b0;
  VertexAttribute local_188;
  FragmentSource local_160;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"a_position","");
  local_188.name._M_dataplus._M_p = (pointer)&local_188.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_1d8,local_1d0 + (long)local_1d8);
  local_188.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_188);
  local_1b4.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1b4);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"u_color","");
  local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_1f8,local_1f0 + (long)local_1f8);
  local_1b0.type = TYPE_FLOAT_VEC4;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1b0);
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_238.source._M_dataplus._M_p = (pointer)&local_238.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_258,local_250 + (long)local_258);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_238);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,"");
  paVar1 = &local_160.source.field_2;
  local_160.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_218,local_210 + (long)local_218);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_160);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.source._M_dataplus._M_p,
                    local_160.source.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.source._M_dataplus._M_p != &local_238.source.field_2) {
    operator_delete(local_238.source._M_dataplus._M_p,
                    local_238.source.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
    operator_delete(local_1b0.name._M_dataplus._M_p,local_1b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.name._M_dataplus._M_p != &local_188.name.field_2) {
    operator_delete(local_188.name._M_dataplus._M_p,local_188.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00d0fb00;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00d0fb38;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00d0fb50;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_color");
  this->u_color = pUVar3;
  return;
}

Assistant:

DepthShader::DepthShader (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::VertexSource("#version 300 es\n"
														"in highp vec4 a_position;\n"
														"void main (void)\n"
														"{\n"
														"	gl_Position = a_position;\n"
														"}\n")
							<< sglr::pdec::FragmentSource("#version 300 es\n"
														  "uniform highp vec4 u_color;\n"
														  "layout(location = 0) out mediump vec4 o_color;\n"
														  "void main (void)\n"
														  "{\n"
														  "	o_color = u_color;\n"
														  "}\n"))
	, u_color(getUniformByName("u_color"))
{
}